

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O0

int SET_OF_constraint(asn_TYPE_descriptor_t *td,void *sptr,asn_app_constraint_failed_f *ctfailcb,
                     void *app_key)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined8 in_RCX;
  code *in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  int ret;
  void *memb_ptr;
  int i;
  asn_anonymous_set_ *list;
  asn_constr_check_f *constr;
  asn_TYPE_member_t *elm;
  int local_44;
  code *local_38;
  int local_4;
  
  lVar1 = in_RDI[0x11];
  if (in_RSI == (long *)0x0) {
    if (in_RDX != (code *)0x0) {
      (*in_RDX)(in_RCX,in_RDI,0,"%s: value not given (%s:%d)",*in_RDI,
                "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/asn1/constr_SET_OF.c"
                ,0x344);
    }
    local_4 = -1;
  }
  else {
    local_38 = *(code **)(lVar1 + 0x20);
    if (local_38 == (code *)0x0) {
      local_38 = *(code **)(*(long *)(lVar1 + 0x18) + 0x20);
    }
    for (local_44 = 0; local_44 < (int)in_RSI[1]; local_44 = local_44 + 1) {
      lVar2 = *(long *)(*in_RSI + (long)local_44 * 8);
      if ((lVar2 != 0) &&
         (iVar3 = (*local_38)(*(undefined8 *)(lVar1 + 0x18),lVar2,in_RDX,in_RCX), iVar3 != 0)) {
        return iVar3;
      }
    }
    if (*(long *)(lVar1 + 0x20) == 0) {
      *(undefined8 *)(lVar1 + 0x20) = *(undefined8 *)(*(long *)(lVar1 + 0x18) + 0x20);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
SET_OF_constraint(asn_TYPE_descriptor_t *td, const void *sptr,
		asn_app_constraint_failed_f *ctfailcb, void *app_key) {
	asn_TYPE_member_t *elm = td->elements;
	asn_constr_check_f *constr;
	const asn_anonymous_set_ *list = _A_CSET_FROM_VOID(sptr);
	int i;

	if(!sptr) {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: value not given (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}

	constr = elm->memb_constraints;
	if(!constr) constr = elm->type->check_constraints;

	/*
	 * Iterate over the members of an array.
	 * Validate each in turn, until one fails.
	 */
	for(i = 0; i < list->count; i++) {
		const void *memb_ptr = list->array[i];
		int ret;

		if(!memb_ptr) continue;

		ret = constr(elm->type, memb_ptr, ctfailcb, app_key);
		if(ret) return ret;
	}

	/*
	 * Cannot inherit it eralier:
	 * need to make sure we get the updated version.
	 */
	if(!elm->memb_constraints)
		elm->memb_constraints = elm->type->check_constraints;

	return 0;
}